

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

void __thiscall
tcmalloc::CentralFreeList::InsertRange(CentralFreeList *this,void *start,void *end,int N)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  SizeMap *this_00;
  TCEntry *entry;
  int slot;
  SpinLockHolder local_30;
  SpinLockHolder h;
  int N_local;
  void *end_local;
  void *start_local;
  CentralFreeList *this_local;
  
  h.lock_._4_4_ = N;
  SpinLockHolder::SpinLockHolder(&local_30,&this->lock_);
  iVar1 = h.lock_._4_4_;
  this_00 = Static::sizemap();
  iVar3 = SizeMap::num_objects_to_move(this_00,(uint32_t)this->size_class_);
  if ((iVar1 == iVar3) && (bVar2 = MakeCacheSpace(this), bVar2)) {
    iVar1 = this->used_slots_;
    this->used_slots_ = iVar1 + 1;
    this->tc_slots_[iVar1].head = start;
    this->tc_slots_[iVar1].tail = end;
  }
  else {
    ReleaseListToSpans(this,start);
  }
  SpinLockHolder::~SpinLockHolder(&local_30);
  return;
}

Assistant:

void CentralFreeList::InsertRange(void *start, void *end, int N) {
  SpinLockHolder h(&lock_);
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
    MakeCacheSpace()) {
    int slot = used_slots_++;
    ASSERT(slot >=0);
    ASSERT(slot < max_cache_size_);
    TCEntry *entry = &tc_slots_[slot];
    entry->head = start;
    entry->tail = end;
    return;
  }
  ReleaseListToSpans(start);
}